

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O0

double __thiscall Nova::Vector<double,_3,_true>::Normalize(Vector<double,_3,_true> *this)

{
  Vector<double,_3,_true> local_48;
  Vector<double,_3,_true> local_30;
  double local_18;
  double norm;
  Vector<double,_3,_true> *this_local;
  
  norm = (double)this;
  local_18 = Norm(this);
  if ((local_18 != 0.0) || (NAN(local_18))) {
    operator*(&local_30,this,1.0 / local_18);
    operator=(this,&local_30);
  }
  else {
    Axis_Vector(&local_48,0);
    operator=(this,&local_48);
  }
  return local_18;
}

Assistant:

T Normalize()
    {
        T norm=Norm();
        if(norm) *this=this->operator*((T)1./norm);
        else *this=Axis_Vector(0);
        return norm;
    }